

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
format_handler<mock_arg_formatter,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::on_arg_id(format_handler<mock_arg_formatter,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *this,uint id)

{
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
  local_48;
  type local_38;
  
  basic_parse_context<char,_fmt::v5::internal::error_handler>::check_arg_id
            ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)&this->context,id);
  internal::
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  ::do_get_arg((format_arg *)&local_48.string,
               &(this->context).
                super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
               ,id);
  (this->arg).type_ = local_38;
  (this->arg).value_.field_0.long_long_value = local_48.long_long_value;
  (this->arg).value_.field_0.string.size = local_48.string.size;
  return;
}

Assistant:

void on_arg_id(unsigned id) {
    context.parse_context().check_arg_id(id);
    arg = context.get_arg(id);
  }